

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Impl * kj::_::FiberStack::Impl::alloc(size_t stackSize,ucontext_t *context)

{
  UnwindDetector *this;
  Impl *pIVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  Type *func;
  Fault local_c8;
  Fault f_2;
  SyscallResult local_b4;
  Impl *pIStack_b0;
  SyscallResult _kjSyscallResult_1;
  Impl *impl;
  Fault f_1;
  SyscallResult local_8c;
  undefined1 auStack_88 [4];
  SyscallResult _kjSyscallResult;
  void *stack;
  ArrayDisposer *local_78;
  void **local_70;
  undefined1 local_68 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1412:5)>
  _kjDefer1414;
  UnwindDetector _kjUnwindDetector1414;
  Fault local_38;
  Fault f;
  void *stackMapping;
  size_t allocSize;
  size_t pageSize;
  ucontext_t *context_local;
  size_t stackSize_local;
  
  pageSize = (size_t)context;
  context_local = (ucontext_t *)stackSize;
  allocSize = getPageSize();
  stackMapping = (void *)((long)(context_local->uc_mcontext).gregs + (allocSize - 0x28));
  f.exception = (Exception *)mmap((void *)0x0,(size_t)stackMapping,0,0x22,-1,0);
  if (f.exception == (Exception *)0xffffffffffffffff) {
    piVar3 = __errno_location();
    Debug::Fault::Fault(&local_38,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                        ,0x582,*piVar3,"mmap(new stack)","");
    Debug::Fault::fatal(&local_38);
  }
  this = (UnwindDetector *)((long)&_kjDefer1414.maybeFunc.ptr.field_1 + 0x10);
  UnwindDetector::UnwindDetector(this);
  local_78 = (ArrayDisposer *)&f;
  local_70 = &stackMapping;
  stack = this;
  defer<kj::_::FiberStack::Impl::alloc(unsigned_long,ucontext_t*)::_lambda()_1_>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1412:5)>
              *)local_68,(kj *)&stack,func);
  _auStack_88 = (char *)((long)(f.exception)->trace + (allocSize - 0x68));
  f_1.exception = (Exception *)auStack_88;
  local_8c = Debug::syscall<kj::_::FiberStack::Impl::alloc(unsigned_long,ucontext_t*)::_lambda()_2_>
                       ((anon_class_16_2_8fad328a *)&f_1,false);
  pvVar4 = Debug::SyscallResult::operator_cast_to_void_(&local_8c);
  if (pvVar4 != (void *)0x0) {
    pIStack_b0 = (Impl *)(_auStack_88 + -400 + (long)context_local);
    f_2.exception = (Exception *)&pageSize;
    local_b4 = Debug::
               syscall<kj::_::FiberStack::Impl::alloc(unsigned_long,ucontext_t*)::_lambda()_3_>
                         ((anon_class_8_1_bc11688f *)&f_2,false);
    pvVar4 = Debug::SyscallResult::operator_cast_to_void_(&local_b4);
    pIVar1 = pIStack_b0;
    if (pvVar4 != (void *)0x0) {
      *(_libc_fpxreg **)(pageSize + 0x20) = context_local[-1].__fpregs_mem._st + 7;
      *(char **)(pageSize + 0x10) = _auStack_88;
      *(undefined4 *)(pageSize + 0x18) = 0;
      *(undefined8 *)(pageSize + 8) = 0;
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:1412:5)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1412:5)>
                   *)local_68);
      return pIVar1;
    }
    iVar2 = Debug::SyscallResult::getErrorNumber(&local_b4);
    Debug::Fault::Fault(&local_c8,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                        ,0x59a,iVar2,"getcontext(context)","");
    Debug::Fault::fatal(&local_c8);
  }
  iVar2 = Debug::SyscallResult::getErrorNumber(&local_8c);
  Debug::Fault::Fault((Fault *)&impl,
                      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                      ,0x593,iVar2,"mprotect(stack, stackSize, PROT_READ | PROT_WRITE)","");
  Debug::Fault::fatal((Fault *)&impl);
}

Assistant:

static Impl* alloc(size_t stackSize, ucontext_t* context) {
#ifndef MAP_ANONYMOUS
#define MAP_ANONYMOUS MAP_ANON
#endif
    size_t pageSize = getPageSize();
    size_t allocSize = stackSize + pageSize;  // size plus guard page and impl

    // Allocate virtual address space for the stack but make it inaccessible initially.
    // TODO(someday): Does it make sense to use MAP_GROWSDOWN on Linux? It's a kind of bizarre flag
    //   that causes the mapping to automatically allocate extra pages (beyond the range specified)
    //   until it hits something... Note that on FreeBSD, MAP_STACK has the effect that
    //   MAP_GROWSDOWN has on Linux. (MAP_STACK, meanwhile, has no effect on Linux.)
    void* stackMapping = mmap(nullptr, allocSize, PROT_NONE,
        MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
    if (stackMapping == MAP_FAILED) {
      KJ_FAIL_SYSCALL("mmap(new stack)", errno);
    }
    KJ_ON_SCOPE_FAILURE({
      KJ_SYSCALL(munmap(stackMapping, allocSize)) { break; }
    });

#if __linux__
#if defined(PR_SET_VMA) && defined(PR_SET_VMA_ANON_NAME)
    // Try to name the virtual memory area for debugging purposes. This may fail if the kernel was
    // not configured with the CONFIG_ANON_VMA_NAME option.
    prctl(PR_SET_VMA, PR_SET_VMA_ANON_NAME, stackMapping, allocSize, "kj_fiber_stack");
#endif
#endif

    void* stack = reinterpret_cast<byte*>(stackMapping) + pageSize;
    // Now mark everything except the guard page as read-write. We assume the stack grows down, so
    // the guard page is at the beginning. No modern architecture uses stacks that grow up.
    KJ_SYSCALL(mprotect(stack, stackSize, PROT_READ | PROT_WRITE));

    // Stick `Impl` at the top of the stack.
    Impl* impl = (reinterpret_cast<Impl*>(reinterpret_cast<byte*>(stack) + stackSize) - 1);

    // Note: mmap() allocates zero'd pages so we don't have to memset() anything here.

    KJ_SYSCALL(getcontext(context));
#if __APPLE__ && __aarch64__
    // Per issue #1386, apple on arm64 zeros the entire configured stack.
    // But this is redundant, since we just allocated the stack with mmap() which
    // returns zero'd pages. Re-zeroing is both slow and results in prematurely
    // allocating pages we may not need -- it's normal for stacks to rely heavily
    // on lazy page allocation to avoid wasting memory. Instead, we lie:
    // we allocate the full size, but tell the ucontext the stack is the last
    // page only. This appears to work as no particular bounds checks or
    // anything are set up based on what we say here.
    context->uc_stack.ss_size = min(pageSize, stackSize) - sizeof(Impl);
    context->uc_stack.ss_sp = reinterpret_cast<char*>(stack) + stackSize - min(pageSize, stackSize);
#else
    context->uc_stack.ss_size = stackSize - sizeof(Impl);
    context->uc_stack.ss_sp = reinterpret_cast<char*>(stack);
#endif
    context->uc_stack.ss_flags = 0;
    // We don't use uc_link since our fiber start routine runs forever in a loop to allow for
    // reuse. When we're done with the fiber, we just destroy it, without switching to it's
    // stack. This is safe since the start routine doesn't allocate any memory or RAII objects
    // before looping.
    context->uc_link = 0;

    return impl;
  }